

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

FilePath * testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  FilePath *in_RDI;
  char cwd [4097];
  string *psVar2;
  string *pathname;
  FilePath *this;
  allocator local_1039;
  string local_1038 [32];
  string local_1018 [128];
  
  this = in_RDI;
  memset(local_1018,0,0x1001);
  pcVar1 = getcwd((char *)local_1018,0x1001);
  if (pcVar1 == (char *)0x0) {
    psVar2 = (string *)0x1dd8f6;
  }
  else {
    psVar2 = local_1018;
  }
  pathname = psVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1038,(char *)psVar2,&local_1039);
  FilePath(this,pathname);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  return in_RDI;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE
  // Windows CE doesn't have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}